

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

Label __thiscall asmjit::CodeBuilder::newLabel(CodeBuilder *this)

{
  Error error;
  Error extraout_EAX;
  CBLabel *node;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  CodeBuilder *in_RSI;
  _func_int **pp_Var1;
  Label LVar2;
  size_t sStack_28;
  
  pp_Var1 = (_func_int **)0xffffffff00000004;
  if ((in_RSI->super_CodeEmitter)._lastError == 0) {
    if ((in_RSI->_cbHeap)._zone == (Zone *)0x0) {
      newLabel();
      error = extraout_EAX;
    }
    else {
      node = (CBLabel *)ZoneHeap::_alloc(&in_RSI->_cbHeap,0x38,&sStack_28);
      (node->super_CBNode)._prev = (CBNode *)0x0;
      (node->super_CBNode)._next = (CBNode *)0x0;
      (node->super_CBNode)._type = '\x04';
      (node->super_CBNode)._opCount = '\0';
      (node->super_CBNode)._flags = (uint16_t)in_RSI->_nodeFlags;
      (node->super_CBNode)._position = in_RSI->_position;
      (node->super_CBNode)._inlineComment = (char *)0x0;
      (node->super_CBNode)._passData = (void *)0x0;
      node->_id = 0xffffffff;
      node->_numRefs = 0;
      node->_from = (CBJump *)0x0;
      error = registerLabelNode(in_RSI,node);
      if (error == 0) {
        pp_Var1 = (_func_int **)((ulong)node->_id << 0x20 | 4);
        in_RDX = extraout_RDX;
        goto LAB_00112680;
      }
    }
    CodeEmitter::setLastError(&in_RSI->super_CodeEmitter,error,(char *)0x0);
    in_RDX = extraout_RDX_00;
  }
LAB_00112680:
  (this->super_CodeEmitter)._vptr_CodeEmitter = pp_Var1;
  (this->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar2.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)in_RDX;
  LVar2.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (Label)LVar2.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeBuilder::newLabel() {
  uint32_t id = kInvalidValue;

  if (!_lastError) {
    CBLabel* node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node)) {
      setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    }
    else {
      Error err = registerLabelNode(node);
      if (ASMJIT_UNLIKELY(err))
        setLastError(err);
      else
        id = node->getId();
    }
  }

  return Label(id);
}